

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

string * nlohmann::json_abi_v3_11_3::detail::exception::name(string *ename,int id_)

{
  int in_EDX;
  string *in_RDI;
  string *this;
  char (*in_stack_ffffffffffffffc8) [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined3 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  
  uVar1 = CONCAT13(0x2e,in_stack_ffffffffffffffe8);
  this = in_RDI;
  std::__cxx11::to_string(in_EDX);
  concat<std::__cxx11::string,char_const(&)[17],std::__cxx11::string_const&,char,std::__cxx11::string,char_const(&)[3]>
            ((char (*) [17])CONCAT44(in_EDX,uVar1),in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::~string(this);
  return in_RDI;
}

Assistant:

static std::string name(const std::string& ename, int id_)
    {
        return concat("[json.exception.", ename, '.', std::to_string(id_), "] ");
    }